

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestDefaultDefault::Run(ParserTestDefaultDefault *this)

{
  Test *pTVar1;
  undefined4 uVar2;
  bool condition;
  int iVar3;
  size_type sVar4;
  vector<Node_*,_std::allocator<Node_*>_> local_50;
  undefined1 local_38 [8];
  string err;
  int fail_count;
  ParserTestDefaultDefault *this_local;
  
  err.field_2._12_4_ = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild a: cat foo\nbuild b: cat foo\nbuild c: cat foo\nbuild d: cat foo\n"
            );
  uVar2 = err.field_2._12_4_;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  if (uVar2 == iVar3) {
    std::__cxx11::string::string((string *)local_38);
    pTVar1 = g_current_test;
    State::DefaultNodes(&local_50,&(this->super_ParserTest).state,(string *)local_38);
    sVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&local_50);
    testing::Test::Check
              (pTVar1,sVar4 == 4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x409,"4u == state.DefaultNodes(&err).size()");
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector(&local_50);
    pTVar1 = g_current_test;
    condition = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_38);
    testing::Test::Check
              (pTVar1,condition,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x40a,"\"\" == err");
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, DefaultDefault) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n  command = cat $in > $out\n"
"build a: cat foo\n"
"build b: cat foo\n"
"build c: cat foo\n"
"build d: cat foo\n"));

  string err;
  EXPECT_EQ(4u, state.DefaultNodes(&err).size());
  EXPECT_EQ("", err);
}